

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,int value)

{
  ostream *this_00;
  void *this_01;
  int iVar1;
  ostringstream local_190 [8];
  ostringstream oss;
  int value_local;
  
  iVar1 = (int)this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (iVar1 < 0x2001) {
    std::ostream::operator<<(local_190,iVar1);
  }
  else {
    this_00 = std::operator<<((ostream *)local_190,"0x");
    this_01 = (void *)std::ostream::operator<<(this_00,std::hex);
    std::ostream::operator<<(this_01,iVar1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( int value ) {
    std::ostringstream oss;
    if( value > 8192 )
        oss << "0x" << std::hex << value;
    else
        oss << value;
    return oss.str();
}